

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.cpp
# Opt level: O0

void __thiscall
iu_Matcher_x_iutest_x_FloatingPoint_Test::~iu_Matcher_x_iutest_x_FloatingPoint_Test
          (iu_Matcher_x_iutest_x_FloatingPoint_Test *this)

{
  iu_Matcher_x_iutest_x_FloatingPoint_Test *this_local;
  
  ~iu_Matcher_x_iutest_x_FloatingPoint_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(Matcher, FloatingPoint)
{
    IUTEST_EXPECT_THAT(f0, FloatEq(0.0f));
    IUTEST_EXPECT_THAT(d0, DoubleEq(0.0));
    IUTEST_EXPECT_THAT(f0, NanSensitiveFloatEq(0.0f));
    IUTEST_EXPECT_THAT(0.0f / f0, NanSensitiveFloatEq(0.0f / f0));
    IUTEST_EXPECT_THAT(d0, NanSensitiveDoubleEq(0.0));
    IUTEST_EXPECT_THAT(0.0 / d0, NanSensitiveDoubleEq(0.0 / d0));
}